

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall duckdb::Node::ReplaceChild(Node *this,ART *art,uint8_t byte,Node child)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  NType NVar2;
  long lVar3;
  type paVar4;
  iterator iVar5;
  pointer pFVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  InternalException *this_00;
  IndexPointer IVar9;
  uint uVar10;
  long lVar11;
  string local_68;
  string local_48;
  
  uVar8 = (this->super_IndexPointer).data;
  NVar2 = (NType)(uVar8 >> 0x38);
  uVar10 = (uint)(uVar8 >> 0x20);
  switch(NVar2 & 0x7f) {
  case NODE_4:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[2].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar8 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    if ((ulong)pdVar7[(_Var1._M_head_impl)->bitmask_offset + lVar11] != 0) {
      lVar3 = (_Var1._M_head_impl)->bitmask_offset + lVar11;
      uVar8 = 0;
      do {
        if (pdVar7[uVar8 + lVar3 + 1] == byte) {
          lVar11 = *(long *)(pdVar7 + uVar8 * 8 + lVar3 + 8);
          ((IndexPointer *)(pdVar7 + uVar8 * 8 + lVar3 + 8))->data =
               (idx_t)child.super_IndexPointer.data;
          if ((ulong)child.super_IndexPointer.data >> 0x38 == 0 || -1 < lVar11) {
            return;
          }
          *(ulong *)(pdVar7 + uVar8 * 8 + lVar3 + 8) =
               (ulong)child.super_IndexPointer.data | 0x8000000000000000;
          return;
        }
        uVar8 = uVar8 + 1;
      } while (pdVar7[(_Var1._M_head_impl)->bitmask_offset + lVar11] != uVar8);
    }
    break;
  case NODE_16:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[3].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar8 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    if ((ulong)pdVar7[(_Var1._M_head_impl)->bitmask_offset + lVar11] != 0) {
      lVar3 = (_Var1._M_head_impl)->bitmask_offset + lVar11;
      uVar8 = 0;
      do {
        if (pdVar7[uVar8 + lVar3 + 1] == byte) {
          lVar11 = *(long *)(pdVar7 + uVar8 * 8 + lVar3 + 0x18);
          ((IndexPointer *)(pdVar7 + uVar8 * 8 + lVar3 + 0x18))->data =
               (idx_t)child.super_IndexPointer.data;
          if ((ulong)child.super_IndexPointer.data >> 0x38 == 0 || -1 < lVar11) {
            return;
          }
          *(ulong *)(pdVar7 + uVar8 * 8 + lVar3 + 0x18) =
               (ulong)child.super_IndexPointer.data | 0x8000000000000000;
          return;
        }
        uVar8 = uVar8 + 1;
      } while (pdVar7[(_Var1._M_head_impl)->bitmask_offset + lVar11] != uVar8);
    }
    break;
  case NODE_48:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[4].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar8 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    IVar9.data = (ulong)child.super_IndexPointer.data | 0x8000000000000000;
    if ((ulong)child.super_IndexPointer.data >> 0x38 == 0) {
      IVar9 = child.super_IndexPointer.data;
    }
    if (-1 < *(long *)(pdVar7 + (ulong)pdVar7[(ulong)byte + 1 + lVar11] * 8 + lVar11 + 0x108)) {
      IVar9 = child.super_IndexPointer.data;
    }
    *(idx_t *)(pdVar7 + (ulong)pdVar7[(ulong)byte + 1 + lVar11] * 8 + lVar11 + 0x108) = IVar9.data;
    break;
  case NODE_256:
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[5].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_68._M_dataplus._M_p = (pointer)(uVar8 & 0xffffffff);
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_68);
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar11 = (_Var1._M_head_impl)->bitmask_offset +
             (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    IVar9.data = (ulong)child.super_IndexPointer.data | 0x8000000000000000;
    if ((ulong)child.super_IndexPointer.data >> 0x38 == 0) {
      IVar9 = child.super_IndexPointer.data;
    }
    if (-1 < *(long *)(pdVar7 + (ulong)byte * 8 + lVar11 + 8)) {
      IVar9 = child.super_IndexPointer.data;
    }
    *(idx_t *)(pdVar7 + (ulong)byte * 8 + lVar11 + 8) = IVar9.data;
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid node type for ReplaceChild: %s.","");
    EnumUtil::ToString<duckdb::NType>(&local_48,NVar2 & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}